

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodePairLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t in_ESI;
  MCInst *in_RDI;
  _Bool NeedsDisjointWritebackTransfer;
  uint Opcode;
  _Bool IsLoad;
  int32_t offset;
  uint Rt2;
  uint Rn;
  uint Rt;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar7;
  uint in_stack_ffffffffffffffbc;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffc4;
  uint RegNo;
  DecodeStatus local_4;
  
  uVar1 = fieldFromInstruction(in_ESI,0,5);
  uVar2 = fieldFromInstruction(in_ESI,5,5);
  uVar3 = fieldFromInstruction(in_ESI,10,5);
  uVar4 = fieldFromInstruction(in_ESI,0xf,7);
  uVar5 = fieldFromInstruction(in_ESI,0x16,1);
  RegNo = CONCAT13(uVar5 != 0,(int3)in_stack_ffffffffffffffc4);
  uVar6 = MCInst_getOpcode(in_RDI);
  uVar8 = in_stack_ffffffffffffffbc & 0xffffff;
  if ((uVar4 & 0x40) != 0) {
    uVar4 = uVar4 | 0xffffff80;
  }
  uVar7 = uVar6;
  if (((((((uVar6 - 0x3b5 < 2) || (uVar6 - 0x3b8 < 2)) || (uVar6 - 0x3bb < 2)) ||
        ((uVar6 - 0x3be < 2 || (uVar6 - 0x3c1 < 2)))) ||
       ((uVar6 - 0x3c4 < 2 || ((uVar6 - 0x749 < 2 || (uVar6 - 0x74c < 2)))))) || (uVar6 - 0x74f < 2)
      ) || ((uVar6 - 0x752 < 2 || (uVar6 - 0x755 < 2)))) {
    DecodeGPR64spRegisterClass
              ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,
               CONCAT44(in_stack_ffffffffffffffbc,uVar6) & 0xffffffffffffff,
               (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  if (uVar6 == 0x3af) {
LAB_002d5b54:
    DecodeFPR64RegisterClass
              ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
               (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
    DecodeFPR64RegisterClass
              ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
               (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
    goto LAB_002d5bb6;
  }
  if (uVar6 == 0x3b0) {
LAB_002d5b22:
    DecodeFPR128RegisterClass
              ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
               (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
    DecodeFPR128RegisterClass
              ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
               (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
    goto LAB_002d5bb6;
  }
  if (uVar6 == 0x3b1) goto LAB_002d5b86;
  if (uVar6 == 0x3b2) goto LAB_002d5aed;
  if (uVar6 != 0x3b3) {
    if (uVar6 - 0x3b4 < 3) goto LAB_002d5b54;
    if (uVar6 - 0x3b7 < 3) goto LAB_002d5b22;
    if (uVar6 != 0x3ba) {
      if (1 < uVar6 - 0x3bb) {
        if (uVar6 - 0x3bd < 3) goto LAB_002d5b86;
        if (uVar6 != 0x3c0) {
          if (1 < uVar6 - 0x3c1) {
            if (uVar6 != 0x3c3) {
              if (uVar6 - 0x3c4 < 2) goto LAB_002d5aae;
              if (uVar6 == 0x743) goto LAB_002d5b54;
              if (uVar6 == 0x744) goto LAB_002d5b22;
              if (uVar6 == 0x745) {
LAB_002d5b86:
                DecodeFPR32RegisterClass
                          ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
                           (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
                DecodeFPR32RegisterClass
                          ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
                           (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
                goto LAB_002d5bb6;
              }
              if (uVar6 == 0x746) goto LAB_002d5aed;
              if (uVar6 != 0x747) {
                if (uVar6 - 0x748 < 3) goto LAB_002d5b54;
                if (uVar6 - 0x74b < 3) goto LAB_002d5b22;
                if (uVar6 - 0x74e < 3) goto LAB_002d5b86;
                if (uVar6 == 0x751) goto LAB_002d5aed;
                if (uVar6 - 0x752 < 2) goto LAB_002d5ae8;
                if (uVar6 != 0x754) {
                  if (1 < uVar6 - 0x755) {
                    return MCDisassembler_Fail;
                  }
                  goto LAB_002d5aae;
                }
              }
            }
            goto LAB_002d5ab3;
          }
LAB_002d5ae8:
          uVar8 = CONCAT13(1,(int3)uVar8);
        }
LAB_002d5aed:
        DecodeGPR32RegisterClass
                  ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
                   (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
        DecodeGPR32RegisterClass
                  ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
                   (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
        goto LAB_002d5bb6;
      }
LAB_002d5aae:
      uVar8 = CONCAT13(1,(int3)uVar8);
    }
  }
LAB_002d5ab3:
  DecodeGPR64RegisterClass
            ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
             (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
  DecodeGPR64RegisterClass
            ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
             (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
LAB_002d5bb6:
  DecodeGPR64spRegisterClass
            ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,CONCAT44(uVar8,uVar7),
             (void *)CONCAT44(uVar6,in_stack_ffffffffffffffb0));
  MCOperand_CreateImm0(in_RDI,(long)(int)uVar4);
  if (((RegNo & 0x1000000) == 0) || (uVar1 != uVar3)) {
    if ((((uVar8 & 0x1000000) == 0) || (uVar2 == 0x1f)) || ((uVar1 != uVar2 && (uVar3 != uVar2)))) {
      local_4 = MCDisassembler_Success;
    }
    else {
      local_4 = MCDisassembler_SoftFail;
    }
  }
  else {
    local_4 = MCDisassembler_SoftFail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodePairLdStInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		const void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rt2 = fieldFromInstruction(insn, 10, 5);
	int32_t offset = fieldFromInstruction(insn, 15, 7);
	bool IsLoad = fieldFromInstruction(insn, 22, 1) != 0;
	unsigned Opcode = MCInst_getOpcode(Inst);
	bool NeedsDisjointWritebackTransfer = false;

	// offset is a 7-bit signed immediate, so sign extend it to
	// fill the unsigned.
	if (offset & (1 << (7 - 1)))
		offset |= ~((1LL << 7) - 1);

	// First operand is always writeback of base register.
	switch (Opcode) {
		default:
			break;
		case AArch64_LDPXpost:
		case AArch64_STPXpost:
		case AArch64_LDPSWpost:
		case AArch64_LDPXpre:
		case AArch64_STPXpre:
		case AArch64_LDPSWpre:
		case AArch64_LDPWpost:
		case AArch64_STPWpost:
		case AArch64_LDPWpre:
		case AArch64_STPWpre:
		case AArch64_LDPQpost:
		case AArch64_STPQpost:
		case AArch64_LDPQpre:
		case AArch64_STPQpre:
		case AArch64_LDPDpost:
		case AArch64_STPDpost:
		case AArch64_LDPDpre:
		case AArch64_STPDpre:
		case AArch64_LDPSpost:
		case AArch64_STPSpost:
		case AArch64_LDPSpre:
		case AArch64_STPSpre:
			DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
			break;
	}

	switch (Opcode) {
		default:
			return Fail;
		case AArch64_LDPXpost:
		case AArch64_STPXpost:
		case AArch64_LDPSWpost:
		case AArch64_LDPXpre:
		case AArch64_STPXpre:
		case AArch64_LDPSWpre:
			NeedsDisjointWritebackTransfer = true;
			// Fallthrough
		case AArch64_LDNPXi:
		case AArch64_STNPXi:
		case AArch64_LDPXi:
		case AArch64_STPXi:
		case AArch64_LDPSWi:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDPWpost:
		case AArch64_STPWpost:
		case AArch64_LDPWpre:
		case AArch64_STPWpre:
			NeedsDisjointWritebackTransfer = true;
			// Fallthrough
		case AArch64_LDNPWi:
		case AArch64_STNPWi:
		case AArch64_LDPWi:
		case AArch64_STPWi:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPQi:
		case AArch64_STNPQi:
		case AArch64_LDPQpost:
		case AArch64_STPQpost:
		case AArch64_LDPQi:
		case AArch64_STPQi:
		case AArch64_LDPQpre:
		case AArch64_STPQpre:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR128RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPDi:
		case AArch64_STNPDi:
		case AArch64_LDPDpost:
		case AArch64_STPDpost:
		case AArch64_LDPDi:
		case AArch64_STPDi:
		case AArch64_LDPDpre:
		case AArch64_STPDpre:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPSi:
		case AArch64_STNPSi:
		case AArch64_LDPSpost:
		case AArch64_STPSpost:
		case AArch64_LDPSi:
		case AArch64_STPSi:
		case AArch64_LDPSpre:
		case AArch64_STPSpre:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	MCOperand_CreateImm0(Inst, offset);

	// You shouldn't load to the same register twice in an instruction...
	if (IsLoad && Rt == Rt2)
		return SoftFail;

	// ... or do any operation that writes-back to a transfer register. But note
	// that "stp xzr, xzr, [sp], #4" is fine because xzr and sp are different.
	if (NeedsDisjointWritebackTransfer && Rn != 31 && (Rt == Rn || Rt2 == Rn))
		return SoftFail;

	return Success;
}